

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

bool __thiscall Rml::Element::IsVisible(Element *this,bool include_ancestors)

{
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,include_ancestors) == 0) {
    return this->visible;
  }
  do {
    if (this->visible != true) {
      return false;
    }
    this = this->parent;
  } while (this != (Element *)0x0);
  return this == (Element *)0x0;
}

Assistant:

bool Element::IsVisible(bool include_ancestors) const
{
	if (!include_ancestors)
		return visible;
	const Element* element = this;
	while (element)
	{
		if (!element->visible)
			return false;
		element = element->parent;
	}
	return true;
}